

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* spirv_cross::CompilerMSL::get_illegal_func_names_abi_cxx11_(void)

{
  int iVar1;
  long lVar2;
  undefined1 local_104b;
  undefined1 local_104a;
  undefined1 local_1049;
  undefined1 *local_1048 [2];
  undefined1 local_1038 [16];
  undefined1 *local_1028 [2];
  undefined1 local_1018 [16];
  undefined1 *local_1008 [2];
  undefined1 local_ff8 [16];
  undefined1 *local_fe8 [2];
  undefined1 local_fd8 [16];
  undefined1 *local_fc8 [2];
  undefined1 local_fb8 [16];
  undefined1 *local_fa8 [2];
  undefined1 local_f98 [16];
  undefined1 *local_f88 [2];
  undefined1 local_f78 [16];
  undefined1 *local_f68 [2];
  undefined1 local_f58 [16];
  undefined1 *local_f48 [2];
  undefined1 local_f38 [16];
  undefined1 *local_f28 [2];
  undefined1 local_f18 [16];
  undefined1 *local_f08 [2];
  undefined1 local_ef8 [16];
  undefined1 *local_ee8 [2];
  undefined1 local_ed8 [16];
  undefined1 *local_ec8 [2];
  undefined1 local_eb8 [16];
  undefined1 *local_ea8 [2];
  undefined1 local_e98 [16];
  undefined1 *local_e88 [2];
  undefined1 local_e78 [16];
  undefined1 *local_e68 [2];
  undefined1 local_e58 [16];
  undefined1 *local_e48 [2];
  undefined1 local_e38 [16];
  undefined1 *local_e28 [2];
  undefined1 local_e18 [16];
  undefined1 *local_e08 [2];
  undefined1 local_df8 [16];
  undefined1 *local_de8 [2];
  undefined1 local_dd8 [16];
  undefined1 *local_dc8 [2];
  undefined1 local_db8 [16];
  undefined1 *local_da8 [2];
  undefined1 local_d98 [16];
  undefined1 *local_d88 [2];
  undefined1 local_d78 [16];
  undefined1 *local_d68 [2];
  undefined1 local_d58 [16];
  undefined1 *local_d48 [2];
  undefined1 local_d38 [16];
  undefined1 *local_d28 [2];
  undefined1 local_d18 [16];
  undefined1 *local_d08 [2];
  undefined1 local_cf8 [16];
  undefined1 *local_ce8 [2];
  undefined1 local_cd8 [16];
  undefined1 *local_cc8 [2];
  undefined1 local_cb8 [16];
  undefined1 *local_ca8 [2];
  undefined1 local_c98 [16];
  undefined1 *local_c88 [2];
  undefined1 local_c78 [16];
  undefined1 *local_c68 [2];
  undefined1 local_c58 [16];
  undefined1 *local_c48 [2];
  undefined1 local_c38 [16];
  undefined1 *local_c28 [2];
  undefined1 local_c18 [16];
  undefined1 *local_c08 [2];
  undefined1 local_bf8 [16];
  undefined1 *local_be8 [2];
  undefined1 local_bd8 [16];
  undefined1 *local_bc8 [2];
  undefined1 local_bb8 [16];
  undefined1 *local_ba8 [2];
  undefined1 local_b98 [16];
  undefined1 *local_b88 [2];
  undefined1 local_b78 [16];
  undefined1 *local_b68 [2];
  undefined1 local_b58 [16];
  undefined1 *local_b48 [2];
  undefined1 local_b38 [16];
  undefined1 *local_b28 [2];
  undefined1 local_b18 [16];
  undefined1 *local_b08 [2];
  undefined1 local_af8 [16];
  undefined1 *local_ae8 [2];
  undefined1 local_ad8 [16];
  undefined1 *local_ac8 [2];
  undefined1 local_ab8 [16];
  undefined1 *local_aa8 [2];
  undefined1 local_a98 [16];
  undefined1 *local_a88 [2];
  undefined1 local_a78 [16];
  undefined1 *local_a68 [2];
  undefined1 local_a58 [16];
  undefined1 *local_a48 [2];
  undefined1 local_a38 [16];
  undefined1 *local_a28 [2];
  undefined1 local_a18 [16];
  undefined1 *local_a08 [2];
  undefined1 local_9f8 [16];
  undefined1 *local_9e8 [2];
  undefined1 local_9d8 [16];
  undefined1 *local_9c8 [2];
  undefined1 local_9b8 [16];
  undefined1 *local_9a8 [2];
  undefined1 local_998 [16];
  undefined1 *local_988 [2];
  undefined1 local_978 [16];
  undefined1 *local_968 [2];
  undefined1 local_958 [16];
  undefined1 *local_948 [2];
  undefined1 local_938 [16];
  undefined1 *local_928 [2];
  undefined1 local_918 [16];
  undefined1 *local_908 [2];
  undefined1 local_8f8 [16];
  undefined1 *local_8e8 [2];
  undefined1 local_8d8 [16];
  undefined1 *local_8c8 [2];
  undefined1 local_8b8 [16];
  undefined1 *local_8a8 [2];
  undefined1 local_898 [16];
  undefined1 *local_888 [2];
  undefined1 local_878 [16];
  undefined1 *local_868 [2];
  undefined1 local_858 [16];
  undefined1 *local_848 [2];
  undefined1 local_838 [16];
  undefined1 *local_828 [2];
  undefined1 local_818 [16];
  undefined1 *local_808 [2];
  undefined1 local_7f8 [16];
  undefined1 *local_7e8 [2];
  undefined1 local_7d8 [16];
  undefined1 *local_7c8 [2];
  undefined1 local_7b8 [16];
  undefined1 *local_7a8 [2];
  undefined1 local_798 [16];
  undefined1 *local_788 [2];
  undefined1 local_778 [16];
  undefined1 *local_768 [2];
  undefined1 local_758 [16];
  undefined1 *local_748 [2];
  undefined1 local_738 [16];
  undefined1 *local_728 [2];
  undefined1 local_718 [16];
  undefined1 *local_708 [2];
  undefined1 local_6f8 [16];
  undefined1 *local_6e8 [2];
  undefined1 local_6d8 [16];
  undefined1 *local_6c8 [2];
  undefined1 local_6b8 [16];
  undefined1 *local_6a8 [2];
  undefined1 local_698 [16];
  undefined1 *local_688 [2];
  undefined1 local_678 [16];
  undefined1 *local_668 [2];
  undefined1 local_658 [16];
  undefined1 *local_648 [2];
  undefined1 local_638 [16];
  undefined1 *local_628 [2];
  undefined1 local_618 [16];
  undefined1 *local_608 [2];
  undefined1 local_5f8 [16];
  undefined1 *local_5e8 [2];
  undefined1 local_5d8 [16];
  undefined1 *local_5c8 [2];
  undefined1 local_5b8 [16];
  undefined1 *local_5a8 [2];
  undefined1 local_598 [16];
  undefined1 *local_588 [2];
  undefined1 local_578 [16];
  undefined1 *local_568 [2];
  undefined1 local_558 [16];
  undefined1 *local_548 [2];
  undefined1 local_538 [16];
  undefined1 *local_528 [2];
  undefined1 local_518 [16];
  undefined1 *local_508 [2];
  undefined1 local_4f8 [16];
  undefined1 *local_4e8 [2];
  undefined1 local_4d8 [16];
  undefined1 *local_4c8 [2];
  undefined1 local_4b8 [16];
  undefined1 *local_4a8 [2];
  undefined1 local_498 [16];
  undefined1 *local_488 [2];
  undefined1 local_478 [16];
  undefined1 *local_468 [2];
  undefined1 local_458 [16];
  undefined1 *local_448 [2];
  undefined1 local_438 [16];
  undefined1 *local_428 [2];
  undefined1 local_418 [16];
  undefined1 *local_408 [2];
  undefined1 local_3f8 [16];
  undefined1 *local_3e8 [2];
  undefined1 local_3d8 [16];
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  undefined1 *local_3a8 [2];
  undefined1 local_398 [16];
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  undefined1 *local_368 [2];
  undefined1 local_358 [16];
  undefined1 *local_348 [2];
  undefined1 local_338 [16];
  undefined1 *local_328 [2];
  undefined1 local_318 [16];
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  undefined1 *local_268 [2];
  undefined1 local_258 [16];
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if (get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_)
    ;
    if (iVar1 != 0) {
      local_1048[0] = local_1038;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1048,"main","");
      local_1028[0] = local_1018;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1028,"fragment","");
      local_1008[0] = local_ff8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1008,"vertex","");
      local_fe8[0] = local_fd8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_fe8,"kernel","");
      local_fc8[0] = local_fb8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_fc8,"saturate","");
      local_fa8[0] = local_f98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_fa8,"assert","");
      local_f88[0] = local_f78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f88,"fmin3","");
      local_f68[0] = local_f58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f68,"fmax3","");
      local_f48[0] = local_f38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f48,"divide","");
      local_f28[0] = local_f18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f28,"fmod","");
      local_f08[0] = local_ef8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f08,"median3","");
      local_ee8[0] = local_ed8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_ee8,"VARIABLE_TRACEPOINT","");
      local_ec8[0] = local_eb8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_ec8,"STATIC_DATA_TRACEPOINT","");
      local_ea8[0] = local_e98;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_ea8,"STATIC_DATA_TRACEPOINT_V","");
      local_e88[0] = local_e78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e88,"METAL_ALIGN","");
      local_e68[0] = local_e58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e68,"METAL_ASM","");
      local_e48[0] = local_e38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e48,"METAL_CONST","");
      local_e28[0] = local_e18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e28,"METAL_DEPRECATED","");
      local_e08[0] = local_df8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e08,"METAL_ENABLE_IF","");
      local_de8[0] = local_dd8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_de8,"METAL_FUNC","");
      local_dc8[0] = local_db8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_dc8,"METAL_INTERNAL","");
      local_da8[0] = local_d98;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_da8,"METAL_NON_NULL_RETURN","");
      local_d88[0] = local_d78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d88,"METAL_NORETURN","");
      local_d68[0] = local_d58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d68,"METAL_NOTHROW","");
      local_d48[0] = local_d38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d48,"METAL_PURE","");
      local_d28[0] = local_d18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"METAL_UNAVAILABLE","");
      local_d08[0] = local_cf8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d08,"METAL_IMPLICIT","");
      local_ce8[0] = local_cd8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ce8,"METAL_EXPLICIT","");
      local_cc8[0] = local_cb8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_cc8,"METAL_CONST_ARG","");
      local_ca8[0] = local_c98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ca8,"METAL_ARG_UNIFORM","");
      local_c88[0] = local_c78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c88,"METAL_ZERO_ARG","");
      local_c68[0] = local_c58;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c68,"METAL_VALID_LOD_ARG","");
      local_c48[0] = local_c38;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c48,"METAL_VALID_LEVEL_ARG","");
      local_c28[0] = local_c18;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c28,"METAL_VALID_STORE_ORDER","");
      local_c08[0] = local_bf8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c08,"METAL_VALID_LOAD_ORDER","");
      local_be8[0] = local_bd8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_be8,"METAL_VALID_COMPARE_EXCHANGE_FAILURE_ORDER","");
      local_bc8[0] = local_bb8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_bc8,"METAL_COMPATIBLE_COMPARE_EXCHANGE_ORDERS","");
      local_ba8[0] = local_b98;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_ba8,"METAL_VALID_RENDER_TARGET","");
      local_b88[0] = local_b78;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b88,"is_function_constant_defined","");
      local_b68[0] = local_b58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b68,"CHAR_BIT","");
      local_b48[0] = local_b38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b48,"SCHAR_MAX","");
      local_b28[0] = local_b18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b28,"SCHAR_MIN","");
      local_b08[0] = local_af8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b08,"UCHAR_MAX","");
      local_ae8[0] = local_ad8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"CHAR_MAX","");
      local_ac8[0] = local_ab8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"CHAR_MIN","");
      local_aa8[0] = local_a98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_aa8,"USHRT_MAX","");
      local_a88[0] = local_a78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a88,"SHRT_MAX","");
      local_a68[0] = local_a58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a68,"SHRT_MIN","");
      local_a48[0] = local_a38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a48,"UINT_MAX","");
      local_a28[0] = local_a18;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a28,"INT_MAX","");
      local_a08[0] = local_9f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a08,"INT_MIN","");
      local_9e8[0] = local_9d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9e8,"FLT_DIG","");
      local_9c8[0] = local_9b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9c8,"FLT_MANT_DIG","");
      local_9a8[0] = local_998;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_9a8,"FLT_MAX_10_EXP","");
      local_988[0] = local_978;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_988,"FLT_MAX_EXP","");
      local_968[0] = local_958;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_968,"FLT_MIN_10_EXP","");
      local_948[0] = local_938;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"FLT_MIN_EXP","");
      local_928[0] = local_918;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_928,"FLT_RADIX","");
      local_908[0] = local_8f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_908,"FLT_MAX","");
      local_8e8[0] = local_8d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_8e8,"FLT_MIN","");
      local_8c8[0] = local_8b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"FLT_EPSILON","");
      local_8a8[0] = local_898;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_8a8,"FP_ILOGB0","");
      local_888[0] = local_878;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_888,"FP_ILOGBNAN","");
      local_868[0] = local_858;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_868,"MAXFLOAT","");
      local_848[0] = local_838;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"HUGE_VALF","");
      local_828[0] = local_818;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_828,"INFINITY","");
      local_808[0] = local_7f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_808,"NAN","");
      local_7e8[0] = local_7d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"M_E_F","");
      local_7c8[0] = local_7b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"M_LOG2E_F","");
      local_7a8[0] = local_798;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"M_LOG10E_F","");
      local_788[0] = local_778;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"M_LN2_F","");
      local_768[0] = local_758;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_768,"M_LN10_F","");
      local_748[0] = local_738;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"M_PI_F","");
      local_728[0] = local_718;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_728,"M_PI_2_F","");
      local_708[0] = local_6f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_708,"M_PI_4_F","");
      local_6e8[0] = local_6d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"M_1_PI_F","");
      local_6c8[0] = local_6b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_6c8,"M_2_PI_F","");
      local_6a8[0] = local_698;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"M_2_SQRTPI_F","");
      local_688[0] = local_678;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"M_SQRT2_F","");
      local_668[0] = local_658;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_668,"M_SQRT1_2_F","");
      local_648[0] = local_638;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_648,"HALF_DIG","");
      local_628[0] = local_618;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"HALF_MANT_DIG","");
      local_608[0] = local_5f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"HALF_MAX_10_EXP","");
      local_5e8[0] = local_5d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"HALF_MAX_EXP","");
      local_5c8[0] = local_5b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"HALF_MIN_10_EXP","");
      local_5a8[0] = local_598;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5a8,"HALF_MIN_EXP","");
      local_588[0] = local_578;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"HALF_RADIX","");
      local_568[0] = local_558;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_568,"HALF_MAX","");
      local_548[0] = local_538;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"HALF_MIN","");
      local_528[0] = local_518;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"HALF_EPSILON","");
      local_508[0] = local_4f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"MAXHALF","");
      local_4e8[0] = local_4d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"HUGE_VALH","");
      local_4c8[0] = local_4b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"M_E_H","");
      local_4a8[0] = local_498;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"M_LOG2E_H","");
      local_488[0] = local_478;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"M_LOG10E_H","");
      local_468[0] = local_458;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"M_LN2_H","");
      local_448[0] = local_438;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"M_LN10_H","");
      local_428[0] = local_418;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"M_PI_H","");
      local_408[0] = local_3f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"M_PI_2_H","");
      local_3e8[0] = local_3d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"M_PI_4_H","");
      local_3c8[0] = local_3b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"M_1_PI_H","");
      local_3a8[0] = local_398;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"M_2_PI_H","");
      local_388[0] = local_378;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"M_2_SQRTPI_H","");
      local_368[0] = local_358;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"M_SQRT2_H","");
      local_348[0] = local_338;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"M_SQRT1_2_H","");
      local_328[0] = local_318;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"DBL_DIG","");
      local_308[0] = local_2f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"DBL_MANT_DIG","");
      local_2e8[0] = local_2d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"DBL_MAX_10_EXP","");
      local_2c8[0] = local_2b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"DBL_MAX_EXP","");
      local_2a8[0] = local_298;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"DBL_MIN_10_EXP","");
      local_288[0] = local_278;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"DBL_MIN_EXP","");
      local_268[0] = local_258;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"DBL_RADIX","");
      local_248[0] = local_238;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"DBL_MAX","");
      local_228[0] = local_218;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"DBL_MIN","");
      local_208[0] = local_1f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"DBL_EPSILON","");
      local_1e8[0] = local_1d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"HUGE_VAL","");
      local_1c8[0] = local_1b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"M_E","");
      local_1a8[0] = local_198;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"M_LOG2E","");
      local_188[0] = local_178;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"M_LOG10E","");
      local_168[0] = local_158;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"M_LN2","");
      local_148[0] = local_138;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"M_LN10","");
      local_128[0] = local_118;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"M_PI","");
      local_108[0] = local_f8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"M_PI_2","");
      local_e8[0] = local_d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"M_PI_4","");
      local_c8[0] = local_b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"M_1_PI","");
      local_a8[0] = local_98;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"M_2_PI","");
      local_88[0] = local_78;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"M_2_SQRTPI","");
      local_68[0] = local_58;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"M_SQRT2","");
      local_48[0] = local_38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"M_SQRT1_2","");
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_,local_1048,
                 &stack0xffffffffffffffd8,0,&local_1049,&local_104a,&local_104b);
      lVar2 = 0;
      do {
        if (local_38 + lVar2 != *(undefined1 **)((long)local_48 + lVar2)) {
          operator_delete(*(undefined1 **)((long)local_48 + lVar2));
        }
        lVar2 = lVar2 + -0x20;
      } while (lVar2 != -0x1020);
      __cxa_atexit(::std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_);
    }
  }
  return &get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_;
}

Assistant:

const std::unordered_set<std::string> &CompilerMSL::get_illegal_func_names()
{
	static const unordered_set<string> illegal_func_names = {
		"main",
		"fragment",
		"vertex",
		"kernel",
		"saturate",
		"assert",
		"fmin3",
		"fmax3",
		"divide",
		"fmod",
		"median3",
		"VARIABLE_TRACEPOINT",
		"STATIC_DATA_TRACEPOINT",
		"STATIC_DATA_TRACEPOINT_V",
		"METAL_ALIGN",
		"METAL_ASM",
		"METAL_CONST",
		"METAL_DEPRECATED",
		"METAL_ENABLE_IF",
		"METAL_FUNC",
		"METAL_INTERNAL",
		"METAL_NON_NULL_RETURN",
		"METAL_NORETURN",
		"METAL_NOTHROW",
		"METAL_PURE",
		"METAL_UNAVAILABLE",
		"METAL_IMPLICIT",
		"METAL_EXPLICIT",
		"METAL_CONST_ARG",
		"METAL_ARG_UNIFORM",
		"METAL_ZERO_ARG",
		"METAL_VALID_LOD_ARG",
		"METAL_VALID_LEVEL_ARG",
		"METAL_VALID_STORE_ORDER",
		"METAL_VALID_LOAD_ORDER",
		"METAL_VALID_COMPARE_EXCHANGE_FAILURE_ORDER",
		"METAL_COMPATIBLE_COMPARE_EXCHANGE_ORDERS",
		"METAL_VALID_RENDER_TARGET",
		"is_function_constant_defined",
		"CHAR_BIT",
		"SCHAR_MAX",
		"SCHAR_MIN",
		"UCHAR_MAX",
		"CHAR_MAX",
		"CHAR_MIN",
		"USHRT_MAX",
		"SHRT_MAX",
		"SHRT_MIN",
		"UINT_MAX",
		"INT_MAX",
		"INT_MIN",
		"FLT_DIG",
		"FLT_MANT_DIG",
		"FLT_MAX_10_EXP",
		"FLT_MAX_EXP",
		"FLT_MIN_10_EXP",
		"FLT_MIN_EXP",
		"FLT_RADIX",
		"FLT_MAX",
		"FLT_MIN",
		"FLT_EPSILON",
		"FP_ILOGB0",
		"FP_ILOGBNAN",
		"MAXFLOAT",
		"HUGE_VALF",
		"INFINITY",
		"NAN",
		"M_E_F",
		"M_LOG2E_F",
		"M_LOG10E_F",
		"M_LN2_F",
		"M_LN10_F",
		"M_PI_F",
		"M_PI_2_F",
		"M_PI_4_F",
		"M_1_PI_F",
		"M_2_PI_F",
		"M_2_SQRTPI_F",
		"M_SQRT2_F",
		"M_SQRT1_2_F",
		"HALF_DIG",
		"HALF_MANT_DIG",
		"HALF_MAX_10_EXP",
		"HALF_MAX_EXP",
		"HALF_MIN_10_EXP",
		"HALF_MIN_EXP",
		"HALF_RADIX",
		"HALF_MAX",
		"HALF_MIN",
		"HALF_EPSILON",
		"MAXHALF",
		"HUGE_VALH",
		"M_E_H",
		"M_LOG2E_H",
		"M_LOG10E_H",
		"M_LN2_H",
		"M_LN10_H",
		"M_PI_H",
		"M_PI_2_H",
		"M_PI_4_H",
		"M_1_PI_H",
		"M_2_PI_H",
		"M_2_SQRTPI_H",
		"M_SQRT2_H",
		"M_SQRT1_2_H",
		"DBL_DIG",
		"DBL_MANT_DIG",
		"DBL_MAX_10_EXP",
		"DBL_MAX_EXP",
		"DBL_MIN_10_EXP",
		"DBL_MIN_EXP",
		"DBL_RADIX",
		"DBL_MAX",
		"DBL_MIN",
		"DBL_EPSILON",
		"HUGE_VAL",
		"M_E",
		"M_LOG2E",
		"M_LOG10E",
		"M_LN2",
		"M_LN10",
		"M_PI",
		"M_PI_2",
		"M_PI_4",
		"M_1_PI",
		"M_2_PI",
		"M_2_SQRTPI",
		"M_SQRT2",
		"M_SQRT1_2",
	};

	return illegal_func_names;
}